

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

char * imap_atom(char *str,_Bool escape_only)

{
  char cVar1;
  CURLcode CVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  dynbuf line;
  dynbuf dStack_48;
  
  if (str != (char *)0x0) {
    sVar3 = strlen(str);
    sVar4 = strcspn(str,"() {%*]\\\"");
    if (sVar3 == sVar4) {
      pcVar5 = (*Curl_cstrdup)(str);
      return pcVar5;
    }
    Curl_dyn_init(&dStack_48,2000);
    if ((escape_only) || (CVar2 = Curl_dyn_addn(&dStack_48,"\"",1), CVar2 == CURLE_OK)) {
      do {
        cVar1 = *str;
        if ((cVar1 == '\"') || (cVar1 == '\\')) {
          CVar2 = Curl_dyn_addn(&dStack_48,"\\",1);
          if (CVar2 != CURLE_OK) {
            return (char *)0x0;
          }
        }
        else if (cVar1 == '\0') {
          if ((!escape_only) && (CVar2 = Curl_dyn_addn(&dStack_48,"\"",1), CVar2 != CURLE_OK)) {
            return (char *)0x0;
          }
          pcVar5 = Curl_dyn_ptr(&dStack_48);
          return pcVar5;
        }
        CVar2 = Curl_dyn_addn(&dStack_48,str,1);
        str = str + 1;
        if (CVar2 != CURLE_OK) {
          return (char *)0x0;
        }
      } while( true );
    }
  }
  return (char *)0x0;
}

Assistant:

static char *imap_atom(const char *str, bool escape_only)
{
  struct dynbuf line;
  size_t nclean;
  size_t len;

  if(!str)
    return NULL;

  len = strlen(str);
  nclean = strcspn(str, "() {%*]\\\"");
  if(len == nclean)
    /* nothing to escape, return a strdup */
    return strdup(str);

  Curl_dyn_init(&line, 2000);

  if(!escape_only && Curl_dyn_addn(&line, "\"", 1))
    return NULL;

  while(*str) {
    if((*str == '\\' || *str == '"') &&
       Curl_dyn_addn(&line, "\\", 1))
      return NULL;
    if(Curl_dyn_addn(&line, str, 1))
      return NULL;
    str++;
  }

  if(!escape_only && Curl_dyn_addn(&line, "\"", 1))
    return NULL;

  return Curl_dyn_ptr(&line);
}